

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall SearcherThreaded::Start(SearcherThreaded *this,Position *pos)

{
  bool bVar1;
  SearcherThreaded *local_48;
  type local_40 [2];
  thread local_30;
  uint local_24;
  lock_guard<std::mutex> local_20;
  SearchLockType guard;
  Position *pos_local;
  SearcherThreaded *this_local;
  
  guard._M_device = (mutex_type *)pos;
  (*(this->super_SearcherReporting).super_SearcherBase._vptr_SearcherBase[1])();
  SearcherBase::Start((SearcherBase *)this,(Position *)guard._M_device);
  std::lock_guard<std::mutex>::lock_guard
            (&local_20,&(this->super_SearcherReporting).super_SearcherBase.m_Lock);
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic *)&(this->super_SearcherReporting).super_SearcherBase.m_bTerminated);
  if (bVar1) {
    Moves::Clear(&(this->super_SearcherReporting).super_SearcherBase.m_Result);
    std::atomic<bool>::operator=
              (&(this->super_SearcherReporting).super_SearcherBase.m_bTerminated,false);
    DirectorBase::Action(&(this->super_SearcherReporting).super_SearcherBase.m_Director);
    local_40[1] = 0;
    local_40[0] = 0x21;
    local_48 = this;
    std::thread::thread<int(SearcherThreaded::*)(),SearcherThreaded*,void>
              (&local_30,local_40,&local_48);
    std::thread::operator=(&(this->super_SearcherReporting).super_SearcherBase.m_Thread,&local_30);
    std::thread::~thread(&local_30);
  }
  local_24 = (uint)!bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

virtual void Start( const Position &pos )
    {
        Stop();

        super::Start( pos );

        SearchLockType guard( m_Lock );

        if ( m_bTerminated == false )
            return;

        m_Result.Clear();
        m_bTerminated = false;
        m_Director.Action();
        m_Thread = thread( &SearcherThreaded::Search, this );
    }